

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O0

int tcp_listener_get_keepalive(void *arg,void *buf,size_t *szp,nni_type t)

{
  byte bVar1;
  int iVar2;
  tcp_listener *l;
  _Bool b;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x130));
  bVar1 = *(byte *)((long)arg + 299);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
  iVar2 = nni_copyout_bool((_Bool)(bVar1 & 1),buf,szp,t);
  return iVar2;
}

Assistant:

static int
tcp_listener_get_keepalive(void *arg, void *buf, size_t *szp, nni_type t)
{
	bool          b;
	tcp_listener *l = arg;
	nni_mtx_lock(&l->mtx);
	b = l->keepalive;
	nni_mtx_unlock(&l->mtx);
	return (nni_copyout_bool(b, buf, szp, t));
}